

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::span_lite::span<char,18446744073709551615ul>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::span_lite::span<char,18446744073709551615ul>const&> *this,
          span<unsigned_char,_18446744073709551615UL> *rhs)

{
  char *pcVar1;
  byte bVar2;
  lest *this_00;
  size_type sVar3;
  size_type sVar4;
  span<unsigned_char,_18446744073709551615UL> *in_R8;
  bool bVar5;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  bool local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  span<char,_18446744073709551615UL> local_70;
  char local_60 [16];
  string local_50;
  
  this_00 = *(lest **)this;
  sVar3 = *(size_type *)(this_00 + 8);
  if (sVar3 == rhs->size_) {
    bVar5 = sVar3 == 0;
    if (bVar5) goto LAB_0019845f;
    if ((int)**(char **)this_00 == (uint)*rhs->data_) {
      sVar4 = 1;
      do {
        bVar5 = sVar3 == sVar4;
        if (bVar5) goto LAB_0019845f;
        pcVar1 = *(char **)this_00 + sVar4;
        bVar2 = rhs->data_[sVar4];
        in_R8 = (span<unsigned_char,_18446744073709551615UL> *)(ulong)bVar2;
        sVar4 = sVar4 + 1;
      } while ((int)*pcVar1 == (uint)bVar2);
    }
  }
  bVar5 = false;
LAB_0019845f:
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"==","");
  local_70.data_ = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d8,local_d8 + local_d0);
  to_string<nonstd::span_lite::span<char,18446744073709551615ul>,nonstd::span_lite::span<unsigned_char,18446744073709551615ul>>
            (&local_50,this_00,&local_70,(string *)rhs,in_R8);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_98 = bVar5;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b8,local_b8 + local_b0);
  __return_storage_ptr__->passed = local_98;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_90,local_90 + local_88);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70.data_ != local_60) {
    operator_delete(local_70.data_);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }